

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

cmListFileBacktrace __thiscall
cmTargetInternals::GetBacktrace(cmTargetInternals *this,optional<cmListFileBacktrace> *bt)

{
  size_t *psVar1;
  cmMakefile *pcVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  cmListFileBacktrace cVar3;
  
  if (*(char *)&in_RDX._M_pi[1]._vptr__Sp_counted_base == '\x01') {
    *(_func_int ***)this = (in_RDX._M_pi)->_vptr__Sp_counted_base;
    pcVar2 = *(cmMakefile **)&(in_RDX._M_pi)->_M_use_count;
    this->Makefile = pcVar2;
    if (pcVar2 != (cmMakefile *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        psVar1 = &(pcVar2->FindPackageRootPathStack).
                  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_map_size;
        *(int *)psVar1 = (int)*psVar1 + 1;
        UNLOCK();
      }
      else {
        psVar1 = &(pcVar2->FindPackageRootPathStack).
                  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_map_size;
        *(int *)psVar1 = (int)*psVar1 + 1;
      }
    }
  }
  else {
    cVar3 = cmMakefile::GetBacktrace
                      ((cmMakefile *)
                       ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       ((long)&(bt->super__Optional_base<cmListFileBacktrace,_false,_false>).
                               _M_payload.
                               super__Optional_payload<cmListFileBacktrace,_true,_false,_false>.
                               super__Optional_payload_base<cmListFileBacktrace>._M_payload._M_value
                               .super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
                       + 8))->_M_pi);
    in_RDX._M_pi = cVar3.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
  }
  cVar3.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = in_RDX._M_pi;
  cVar3.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (cmListFileBacktrace)
         cVar3.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

cmListFileBacktrace GetBacktrace(
    cm::optional<cmListFileBacktrace> const& bt) const
  {
    return bt ? *bt : this->Makefile->GetBacktrace();
  }